

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXFTypes.cpp
# Opt level: O3

TLVReader * __thiscall ASDCP::MXF::TLVReader::ReadUi8(TLVReader *this,MDDEntry *Entry,ui8_t *value)

{
  bool bVar1;
  undefined1 *in_RCX;
  undefined1 *puVar2;
  
  if (in_RCX == (undefined1 *)0x0) {
    puVar2 = Kumu::RESULT_PTR;
  }
  else {
    bVar1 = FindTL((TLVReader *)Entry,(MDDEntry *)value);
    if (bVar1) {
      if (*(uint *)(Entry->ul + 8) < *(uint *)(Entry->ul + 0xc) + 1) {
        Kumu::Result_t::operator()((int *)this,Kumu::RESULT_FALSE);
        return this;
      }
      *in_RCX = *(undefined1 *)(*(long *)Entry->ul + (ulong)*(uint *)(Entry->ul + 0xc));
      *(int *)(Entry->ul + 0xc) = *(int *)(Entry->ul + 0xc) + 1;
      puVar2 = (undefined1 *)&Kumu::RESULT_OK;
    }
    else {
      puVar2 = Kumu::RESULT_FALSE;
    }
  }
  Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)puVar2);
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::MXF::TLVReader::ReadUi8(const MDDEntry& Entry, ui8_t* value)
{
  ASDCP_TEST_NULL(value);

  if ( FindTL(Entry) )
    return MemIOReader::ReadUi8(value) ? RESULT_OK : RESULT_FALSE(__LINE__, __FILE__);

  return RESULT_FALSE;
}